

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis_simplification.cpp
# Opt level: O0

SENode * __thiscall spvtools::opt::SENodeSimplifyImpl::Simplify(SENodeSimplifyImpl *this)

{
  bool bVar1;
  int iVar2;
  SENode *pSVar3;
  SENodeSimplifyImpl *this_00;
  ChildContainerType *this_01;
  reference ppSVar4;
  NodePtr pSVar5;
  undefined4 extraout_var;
  int local_fc;
  dag_iterator local_f8;
  undefined1 local_a0 [8];
  dag_iterator child_iterator;
  SENode *child;
  iterator __end2;
  iterator __begin2;
  ChildContainerType *__range2;
  SERecurrentNode *recurrent_expr;
  SENode *simplified_polynomial;
  SENodeSimplifyImpl *this_local;
  
  iVar2 = (**this->node_->_vptr_SENode)();
  if (((iVar2 == 2) || (iVar2 = (**this->node_->_vptr_SENode)(), iVar2 == 3)) ||
     (iVar2 = (**this->node_->_vptr_SENode)(), iVar2 == 4)) {
    pSVar3 = SimplifyPolynomial(this);
    __range2 = (ChildContainerType *)0x0;
    this->node_ = pSVar3;
    pSVar3 = FoldRecurrentAddExpressions(this,pSVar3);
    this_00 = (SENodeSimplifyImpl *)EliminateZeroCoefficientRecurrents(this,pSVar3);
    this_01 = SENode::GetChildren((SENode *)this_00);
    __end2 = std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::begin
                       (this_01);
    child = (SENode *)
            std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::end
                      (this_01);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
                                       *)&child), bVar1) {
      ppSVar4 = __gnu_cxx::
                __normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
                ::operator*(&__end2);
      child_iterator.parent_iterators_.c.
      super__Deque_base<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)*ppSVar4;
      iVar2 = (**((SENode *)
                 child_iterator.parent_iterators_.c.
                 super__Deque_base<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node)->_vptr_SENode)();
      if (iVar2 == 1) {
        __range2 = (ChildContainerType *)
                   (*(code *)(*child_iterator.parent_iterators_.c.
                               super__Deque_base<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
                               ._M_impl.super__Deque_impl_data._M_finish._M_node)[3].first)();
      }
      __gnu_cxx::
      __normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
      ::operator++(&__end2);
    }
    SENode::graph_begin((dag_iterator *)local_a0,(SENode *)this_00);
    while( true ) {
      SENode::graph_end(&local_f8,(SENode *)this_00);
      bVar1 = TreeDFIterator<spvtools::opt::SENode>::operator!=
                        ((TreeDFIterator<spvtools::opt::SENode> *)local_a0,&local_f8);
      TreeDFIterator<spvtools::opt::SENode>::~TreeDFIterator(&local_f8);
      if (!bVar1) break;
      pSVar5 = TreeDFIterator<spvtools::opt::SENode>::operator->
                         ((TreeDFIterator<spvtools::opt::SENode> *)local_a0);
      iVar2 = (**pSVar5->_vptr_SENode)();
      if (iVar2 == 1) {
        pSVar5 = TreeDFIterator<spvtools::opt::SENode>::operator->
                           ((TreeDFIterator<spvtools::opt::SENode> *)local_a0);
        iVar2 = (*pSVar5->_vptr_SENode[6])();
        if (__range2 != (ChildContainerType *)CONCAT44(extraout_var,iVar2)) {
          local_fc = 1;
          this_local = this_00;
          goto LAB_00a35a1b;
        }
      }
      TreeDFIterator<spvtools::opt::SENode>::operator++
                ((TreeDFIterator<spvtools::opt::SENode> *)local_a0);
    }
    local_fc = 4;
LAB_00a35a1b:
    TreeDFIterator<spvtools::opt::SENode>::~TreeDFIterator
              ((TreeDFIterator<spvtools::opt::SENode> *)local_a0);
    if ((local_fc != 1) && (this_local = this_00, __range2 != (ChildContainerType *)0x0)) {
      this_local = (SENodeSimplifyImpl *)
                   SimplifyRecurrentAddExpression(this,(SERecurrentNode *)__range2);
    }
  }
  else {
    this_local = (SENodeSimplifyImpl *)this->node_;
  }
  return (SENode *)this_local;
}

Assistant:

SENode* SENodeSimplifyImpl::Simplify() {
  // We only handle graphs with an addition, multiplication, or negation, at the
  // root.
  if (node_->GetType() != SENode::Add && node_->GetType() != SENode::Multiply &&
      node_->GetType() != SENode::Negative)
    return node_;

  SENode* simplified_polynomial = SimplifyPolynomial();

  SERecurrentNode* recurrent_expr = nullptr;
  node_ = simplified_polynomial;

  // Fold recurrent expressions which are with respect to the same loop into a
  // single recurrent expression.
  simplified_polynomial = FoldRecurrentAddExpressions(simplified_polynomial);

  simplified_polynomial =
      EliminateZeroCoefficientRecurrents(simplified_polynomial);

  // Traverse the immediate children of the new node to find the recurrent
  // expression. If there is more than one there is nothing further we can do.
  for (SENode* child : simplified_polynomial->GetChildren()) {
    if (child->GetType() == SENode::RecurrentAddExpr) {
      recurrent_expr = child->AsSERecurrentNode();
    }
  }

  // We need to count the number of unique recurrent expressions in the DAG to
  // ensure there is only one.
  for (auto child_iterator = simplified_polynomial->graph_begin();
       child_iterator != simplified_polynomial->graph_end(); ++child_iterator) {
    if (child_iterator->GetType() == SENode::RecurrentAddExpr &&
        recurrent_expr != child_iterator->AsSERecurrentNode()) {
      return simplified_polynomial;
    }
  }

  if (recurrent_expr) {
    return SimplifyRecurrentAddExpression(recurrent_expr);
  }

  return simplified_polynomial;
}